

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O1

int __thiscall QTemporaryFileEngine::rename(QTemporaryFileEngine *this,char *__old,char *__new)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  
  if (this->unnamedFile == true) {
    bVar1 = materializeUnnamedFile(this,(QString *)__old,DontOverwrite);
    QFSFileEngine::close(&this->super_QFSFileEngine,(int)__old);
    return (int)CONCAT71(extraout_var,bVar1);
  }
  QFSFileEngine::close(&this->super_QFSFileEngine,(int)__old);
  bVar1 = QFSFileEngine::rename_helper(&this->super_QFSFileEngine,(QString *)__old,Rename);
  return (int)CONCAT71(extraout_var_00,bVar1);
}

Assistant:

bool QTemporaryFileEngine::rename(const QString &newName)
{
    if (isUnnamedFile()) {
        bool ok = materializeUnnamedFile(newName, DontOverwrite);
        QFSFileEngine::close();
        return ok;
    }
    QFSFileEngine::close();
    return QFSFileEngine::rename(newName);
}